

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::~IfcRailing(IfcRailing *this)

{
  ~IfcRailing((IfcRailing *)&this[-1].field_0x50);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}